

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brent.c
# Opt level: O0

double brent_local_min(custom_funcuni *funcuni,double a,double b,double t,double eps,double *x)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double fd;
  double fx;
  double fw;
  double fv;
  double fu;
  double w;
  double v;
  double u;
  double t2;
  double tol;
  double r;
  double q;
  double p;
  double m;
  double e;
  double d;
  double c;
  double *x_local;
  double eps_local;
  double t_local;
  double b_local;
  double a_local;
  custom_funcuni *funcuni_local;
  
  dVar1 = sqrt(5.0);
  dVar2 = (3.0 - dVar1) / 2.0;
  *x = dVar2 * (b - a) + a;
  fu = *x;
  m = 0.0;
  fd = (*funcuni->funcuni)(*x,funcuni->params);
  dVar3 = a + b;
  dVar1 = *x;
  fx = fd;
  fw = fd;
  w = fu;
  t_local = b;
  b_local = a;
  do {
    p = dVar3 * 0.5;
    t2 = eps * ABS(dVar1) + t;
    u = t2 * 2.0;
    if (ABS(*x - p) <= (t_local - b_local) * -0.5 + u) {
      return fd;
    }
    q = 0.0;
    r = 0.0;
    tol = 0.0;
    if (t2 < ABS(m)) {
      dVar1 = (*x - fu) * (fd - fw);
      dVar3 = (*x - w) * (fd - fx);
      q = (*x - w) * dVar3 + -((*x - fu) * dVar1);
      r = (dVar3 - dVar1) * 2.0;
      if (r <= 0.0) {
        r = -r;
      }
      else {
        q = -q;
      }
      tol = m;
      m = e;
    }
    if (((ABS(r * 0.5 * tol) <= ABS(q)) || (r * (b_local - *x) <= q)) || (r * (t_local - *x) <= q))
    {
      if (p <= *x) {
        m = b_local - *x;
      }
      else {
        m = t_local - *x;
      }
      e = dVar2 * m;
    }
    else {
      e = q / r;
      if (((*x + e) - b_local < u) || (t_local - (*x + e) < u)) {
        if (p <= *x) {
          e = -t2;
        }
        else {
          e = t2;
        }
      }
    }
    if (ABS(e) < t2) {
      if (e <= 0.0) {
        v = *x - t2;
      }
      else {
        v = *x + t2;
      }
    }
    else {
      v = *x + e;
    }
    dVar1 = (*funcuni->funcuni)(v,funcuni->params);
    if (fd < dVar1) {
      if (*x <= v) {
        t_local = v;
      }
      else {
        b_local = v;
      }
      if (fx < dVar1) {
        if ((fu != *x) || (NAN(fu) || NAN(*x))) {
          if (fw < dVar1) {
            if ((w != *x) || (NAN(w) || NAN(*x))) {
              if ((w != fu) || (NAN(w) || NAN(fu))) goto LAB_0014f732;
            }
          }
          w = v;
          fw = dVar1;
          goto LAB_0014f732;
        }
      }
      w = fu;
      fw = fx;
      fu = v;
      fx = dVar1;
    }
    else {
      if (*x <= v) {
        b_local = *x;
      }
      else {
        t_local = *x;
      }
      w = fu;
      fw = fx;
      fu = *x;
      fx = fd;
      *x = v;
      fd = dVar1;
    }
LAB_0014f732:
    dVar3 = b_local + t_local;
    dVar1 = *x;
  } while( true );
}

Assistant:

double brent_local_min(custom_funcuni *funcuni, double a, double b, double t, double eps, double *x) {
	double c,d,e,m,p,q,r,tol,t2;
	double u,v,w,fu,fv,fw,fx;
	double fd;
	
	fd = eps;
	
	c = (3.0 - sqrt(5.0)) / 2.0;
	*x = a + c * (b - a);
	w = *x; v = w;
	e = 0;
	fx = FUNCUNI_EVAL(funcuni,*x);
	fw = fx; fv = fw;
	
	m = 0.5 * (a + b);
	tol = fd * fabs(*x) + t;
	t2 = 2.0 * tol;
	
	while (fabs(*x - m) > t2 - 0.5 * (b - a)) {
		p = 0; q = 0; r = 0;
		
		if (fabs(e) > tol) {
			r = (*x - w) * (fx - fv);
			q = (*x - v) * (fx - fw);
			p = (*x - v) * q - (*x - w) * r;
			q = 2.0 * (q - r);
			if (q > 0.0) {
				p = -p;
			} else {
				q = -q;
			}
			r = e;
			e = d;
		}
		
		if (fabs(p) < fabs(0.5 * q * r) && p < q * (a - *x) && p < q * (b - *x)) {
			d = p / q;
			u = *x + d;
			
			if ( (u - a) < t2 || (b - u) < t2) {
				if (*x < m) {
					d = tol;
				} else {
					d = -tol;
				}
			}
		} else {
			if (*x < m) {
				e = b - *x;
			} else {
				e = a - *x;
			}
			d = c * e;
		}
		
		if (fabs(d) >= tol) {
			u = *x + d;
		} else if (d > 0) {
			u = *x + tol;
		} else {
			u = *x - tol;
		}
		
		fu = FUNCUNI_EVAL(funcuni,u);
		
		if (fu <= fx) {
			if (u < *x) {
				b = *x;
			} else {
				a = *x;
			}
			v = w;
			fv = fw;
			w = *x;
			fw = fx;
			*x = u;
			fx = fu;
		} else {
			if (u < *x) {
				a = u;
			} else {
				b = u;
			}
			if (fu <= fw || w == *x) {
				v = w;
				fv = fw;
				w = u;
				fw = fu;
			} else if (fu <= fv || v == *x || v == w) {
				v = u;
				fv = fu;
			}
		}
		
		//End of the loop
		m = 0.5 * (a + b);
		tol = fd * fabs(*x) + t;
		t2 = 2.0 * tol;
		
	}
	
	return fx;
}